

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

bool __thiscall
duckdb::
QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::date_t>_>_>
::operator()(QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::date_t>_>_>
             *this,INPUT_TYPE *lhs,INPUT_TYPE *rhs)

{
  DataChunk *pDVar1;
  MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t> *pMVar2;
  CURSOR *pCVar3;
  ulong uVar4;
  reference pvVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  RESULT_TYPE RVar15;
  RESULT_TYPE RVar16;
  INPUT_TYPE local_38;
  INPUT_TYPE local_34;
  
  pMVar2 = this->accessor_l->outer;
  pCVar3 = this->accessor_l->inner->data;
  uVar4 = *lhs;
  if (((pCVar3->scan).next_row_index <= uVar4) || (uVar4 < (pCVar3->scan).current_row_index)) {
    pDVar1 = &pCVar3->page;
    ColumnDataCollection::Seek(pCVar3->inputs,uVar4,&pCVar3->scan,pDVar1);
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    pCVar3->data = (date_t *)pvVar5->data;
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    FlatVector::VerifyFlatVector(pvVar5);
    pCVar3->validity = &pvVar5->validity;
  }
  local_38.days = pCVar3->data[(uint)((int)uVar4 - (int)(pCVar3->scan).current_row_index)].days;
  RVar15 = MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                     (pMVar2,&local_38);
  lVar9 = RVar15.micros;
  pMVar2 = this->accessor_r->outer;
  pCVar3 = this->accessor_r->inner->data;
  uVar4 = *rhs;
  if (((pCVar3->scan).next_row_index <= uVar4) || (uVar4 < (pCVar3->scan).current_row_index)) {
    pDVar1 = &pCVar3->page;
    ColumnDataCollection::Seek(pCVar3->inputs,uVar4,&pCVar3->scan,pDVar1);
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    pCVar3->data = (date_t *)pvVar5->data;
    pvVar5 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
    FlatVector::VerifyFlatVector(pvVar5);
    pCVar3->validity = &pvVar5->validity;
  }
  local_34.days = pCVar3->data[(uint)((int)uVar4 - (int)(pCVar3->scan).current_row_index)].days;
  RVar16 = MadAccessor<duckdb::date_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                     (pMVar2,&local_34);
  lVar11 = RVar16.micros;
  lVar10 = RVar15._0_8_ >> 0x20;
  lVar12 = RVar16._0_8_ >> 0x20;
  if (this->desc == true) {
    lVar10 = lVar10 + lVar9 / 86400000000;
    lVar7 = (long)RVar15.months + lVar10 / 0x1e;
    lVar12 = lVar12 + lVar11 / 86400000000;
    lVar8 = (long)RVar16.months + lVar12 / 0x1e;
    if (lVar8 < lVar7) {
      return true;
    }
    if (lVar7 < lVar8) {
      return false;
    }
    lVar9 = lVar9 % 86400000000;
    lVar10 = lVar10 % 0x1e;
    lVar11 = lVar11 % 86400000000;
    lVar12 = lVar12 % 0x1e;
    if (lVar12 < lVar10) {
      return true;
    }
    bVar6 = lVar12 <= lVar10;
    bVar14 = SBORROW8(lVar9,lVar11);
    lVar12 = lVar9 - lVar11;
    bVar13 = lVar9 == lVar11;
  }
  else {
    lVar12 = lVar12 + lVar11 / 86400000000;
    lVar8 = (long)RVar16.months + lVar12 / 0x1e;
    lVar10 = lVar10 + lVar9 / 86400000000;
    lVar7 = (long)RVar15.months + lVar10 / 0x1e;
    if (lVar7 < lVar8) {
      return true;
    }
    if (lVar8 < lVar7) {
      return false;
    }
    lVar11 = lVar11 % 86400000000;
    lVar12 = lVar12 % 0x1e;
    lVar9 = lVar9 % 86400000000;
    lVar10 = lVar10 % 0x1e;
    if (lVar10 < lVar12) {
      return true;
    }
    bVar6 = lVar10 <= lVar12;
    bVar14 = SBORROW8(lVar11,lVar9);
    lVar12 = lVar11 - lVar9;
    bVar13 = lVar11 == lVar9;
  }
  return (bool)((!bVar13 && bVar14 == lVar12 < 0) & bVar6);
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}